

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  ulong code;
  HUF_CElt *CTable;
  BYTE *ostart_00;
  HUF_CElt *CTable_00;
  size_t sVar5;
  HUF_CElt *in_RCX;
  undefined1 *in_RDX;
  long in_RSI;
  uint *in_RDI;
  uint in_R8D;
  uint in_R9D;
  size_t newSize;
  size_t oldSize;
  size_t hSize;
  size_t unusedSize;
  size_t ctableSize;
  size_t _var_err__;
  size_t maxBits;
  size_t largest;
  size_t largestEnd;
  uint maxSymbolValueEnd;
  size_t largestBegin;
  uint maxSymbolValueBegin;
  size_t largestTotal;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  HUF_compress_tables_t *table;
  void *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  HUF_nbStreams_e in_stack_ffffffffffffff44;
  void *in_stack_ffffffffffffff48;
  uint *in_stack_ffffffffffffff50;
  uint *in_stack_ffffffffffffff58;
  HUF_CElt *in_stack_ffffffffffffff60;
  uint *in_stack_ffffffffffffff68;
  uint *in_stack_ffffffffffffff70;
  HUF_CElt *in_stack_ffffffffffffff78;
  HUF_CElt *CTable_01;
  HUF_CElt *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff94;
  ulong in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint *count;
  uint local_2c;
  HUF_CElt *local_8;
  
  pvVar4 = HUF_alignUpWorkspace
                     (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      (size_t)in_stack_ffffffffffffff58);
  iVar1 = (int)in_RDI + (int)in_RSI;
  if (oldSize < 0x1f08) {
    local_8 = (HUF_CElt *)0xffffffffffffffbe;
  }
  else if (in_RCX == (HUF_CElt *)0x0) {
    local_8 = (HUF_CElt *)0x0;
  }
  else if (in_RSI == 0) {
    local_8 = (HUF_CElt *)0x0;
  }
  else if (in_RCX < (HUF_CElt *)0x20001) {
    if (in_R9D < 0xd) {
      if (in_R8D < 0x100) {
        local_2c = in_R8D;
        if (in_R8D == 0) {
          local_2c = 0xff;
        }
        if (((((uint)ctableSize & 4) == 0) || (unusedSize == 0)) || (*(int *)unusedSize != 2)) {
          count = in_RDI;
          if ((((uint)ctableSize & 8) != 0) && ((HUF_CElt *)0x9fff < in_RCX)) {
            in_stack_ffffffffffffffa4 = local_2c;
            uVar2 = HIST_count_simple(in_stack_ffffffffffffff68,(uint *)in_stack_ffffffffffffff60,
                                      in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
            code = (ulong)uVar2;
            uVar2 = ERR_isError(code);
            if (uVar2 != 0) {
              return code;
            }
            in_stack_ffffffffffffff94 = local_2c;
            in_stack_ffffffffffffff98 = code;
            uVar2 = HIST_count_simple(in_stack_ffffffffffffff68,(uint *)in_stack_ffffffffffffff60,
                                      in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
            in_stack_ffffffffffffff88 = (void *)(ulong)uVar2;
            uVar2 = ERR_isError((size_t)in_stack_ffffffffffffff88);
            if (uVar2 != 0) {
              return (size_t)in_stack_ffffffffffffff88;
            }
            if ((long)in_stack_ffffffffffffff88 + code < 0x45) {
              return 0;
            }
          }
          CTable = (HUF_CElt *)
                   HIST_count_wksp(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                   in_stack_ffffffffffffff48,
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                   in_stack_ffffffffffffff38,0x174076);
          uVar2 = ERR_isError((size_t)CTable);
          local_8 = CTable;
          if (uVar2 == 0) {
            if (CTable == in_RCX) {
              *(undefined1 *)in_RDI = *in_RDX;
              local_8 = (HUF_CElt *)0x1;
            }
            else if ((HUF_CElt *)(((ulong)in_RCX >> 7) + 4) < CTable) {
              if (((unusedSize != 0) && (*(int *)unusedSize == 1)) &&
                 (iVar3 = HUF_validateCTable(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                             (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20)),
                 iVar3 == 0)) {
                *(undefined4 *)unusedSize = 0;
              }
              if (((((uint)ctableSize & 4) == 0) || (unusedSize == 0)) || (*(int *)unusedSize == 0))
              {
                HUF_optimalTableLog(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                    in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
                                    (size_t)CTable,in_stack_ffffffffffffff78,count,iVar1);
                local_8 = (HUF_CElt *)
                          HUF_buildCTable_wksp
                                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                     (U32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                     (U32)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                     (size_t)in_stack_ffffffffffffff58);
                CTable_01 = local_8;
                uVar2 = ERR_isError((size_t)local_8);
                if (uVar2 == 0) {
                  ostart_00 = (BYTE *)(ulong)(local_2c + 2);
                  CTable_00 = (HUF_CElt *)((long)ostart_00 * -8 + 0x808);
                  memset((void *)((long)pvVar4 + (long)ostart_00 * 8 + 0x400),0,(size_t)CTable_00);
                  local_8 = (HUF_CElt *)
                            HUF_writeCTable_wksp
                                      (in_stack_ffffffffffffff88,(size_t)CTable,CTable_01,
                                       (uint)((ulong)local_8 >> 0x20),(uint)local_8,ostart_00,
                                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                      );
                  iVar1 = (int)in_stack_ffffffffffffff88;
                  uVar2 = ERR_isError((size_t)local_8);
                  if (uVar2 == 0) {
                    if ((unusedSize != 0) && (*(int *)unusedSize != 0)) {
                      in_stack_ffffffffffffff50 =
                           (uint *)HUF_estimateCompressedSize
                                             (CTable_00,(uint *)local_8,
                                              (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20));
                      in_stack_ffffffffffffff48 =
                           (void *)HUF_estimateCompressedSize
                                             (CTable_00,(uint *)local_8,
                                              (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20));
                      if ((in_stack_ffffffffffffff50 <=
                           (uint *)((long)local_8 + (long)in_stack_ffffffffffffff48)) ||
                         (in_RCX <= (HUF_CElt *)((long)local_8 + 0xcU))) {
                        sVar5 = HUF_compressCTable_internal
                                          (ostart_00,(BYTE *)CTable_00,(BYTE *)local_8,
                                           in_stack_ffffffffffffff50,
                                           (size_t)in_stack_ffffffffffffff48,
                                           in_stack_ffffffffffffff44,CTable,iVar1);
                        return sVar5;
                      }
                    }
                    if ((HUF_CElt *)((long)local_8 + 0xcU) < in_RCX) {
                      if (unusedSize != 0) {
                        *(undefined4 *)unusedSize = 0;
                      }
                      if (hSize != 0) {
                        memcpy((void *)hSize,(void *)((long)pvVar4 + 0x400),0x808);
                      }
                      local_8 = (HUF_CElt *)
                                HUF_compressCTable_internal
                                          (ostart_00,(BYTE *)CTable_00,(BYTE *)local_8,
                                           in_stack_ffffffffffffff50,
                                           (size_t)in_stack_ffffffffffffff48,
                                           in_stack_ffffffffffffff44,CTable,iVar1);
                    }
                    else {
                      local_8 = (HUF_CElt *)0x0;
                    }
                  }
                }
              }
              else {
                local_8 = (HUF_CElt *)
                          HUF_compressCTable_internal
                                    ((BYTE *)in_stack_ffffffffffffff68,
                                     (BYTE *)in_stack_ffffffffffffff60,
                                     (BYTE *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                     (size_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                                     CTable,(int)in_stack_ffffffffffffff88);
              }
            }
            else {
              local_8 = (HUF_CElt *)0x0;
            }
          }
        }
        else {
          local_8 = (HUF_CElt *)
                    HUF_compressCTable_internal
                              ((BYTE *)in_stack_ffffffffffffff68,(BYTE *)in_stack_ffffffffffffff60,
                               (BYTE *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                               (size_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                               in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff88);
        }
      }
      else {
        local_8 = (HUF_CElt *)0xffffffffffffffd2;
      }
    }
    else {
      local_8 = (HUF_CElt *)0xffffffffffffffd4;
    }
  }
  else {
    local_8 = (HUF_CElt *)0xffffffffffffffb8;
  }
  return (size_t)local_8;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}